

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_lpf_config *
ma_lpf_config_init(ma_lpf_config *__return_storage_ptr__,ma_format format,ma_uint32 channels,
                  ma_uint32 sampleRate,double cutoffFrequency,ma_uint32 order)

{
  ma_uint32 local_4c;
  ma_uint32 order_local;
  double cutoffFrequency_local;
  ma_uint32 sampleRate_local;
  ma_uint32 channels_local;
  ma_format format_local;
  
  memset(__return_storage_ptr__,0,0x20);
  __return_storage_ptr__->format = format;
  __return_storage_ptr__->channels = channels;
  __return_storage_ptr__->sampleRate = sampleRate;
  __return_storage_ptr__->cutoffFrequency = cutoffFrequency;
  local_4c = order;
  if (7 < order) {
    local_4c = 8;
  }
  __return_storage_ptr__->order = local_4c;
  return __return_storage_ptr__;
}

Assistant:

MA_API ma_lpf_config ma_lpf_config_init(ma_format format, ma_uint32 channels, ma_uint32 sampleRate, double cutoffFrequency, ma_uint32 order)
{
    ma_lpf_config config;

    MA_ZERO_OBJECT(&config);
    config.format          = format;
    config.channels        = channels;
    config.sampleRate      = sampleRate;
    config.cutoffFrequency = cutoffFrequency;
    config.order           = ma_min(order, MA_MAX_FILTER_ORDER);

    return config;
}